

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O0

void __thiscall
TPZPostProcAnalysis::SetCompMesh
          (TPZPostProcAnalysis *this,TPZCompMesh *pRef,bool mustOptimizeBandwidth)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  TPZCompMesh *pcPostProcMesh;
  TPZGeoMesh *pgmesh;
  TPZCompMesh *pcMainMesh;
  bool in_stack_00000087;
  TPZGeoMesh *in_stack_00000088;
  TPZCompMesh *in_stack_00000090;
  TPZCompMesh *in_stack_00000170;
  TPZAnalysis *in_stack_ffffffffffffffc0;
  
  if (*(long *)(in_RDI + 0x488) != in_RSI) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
      }
      *(undefined8 *)(in_RDI + 0x10) = 0;
      TPZAnalysis::CleanUp(in_stack_ffffffffffffffc0);
    }
    *(long *)(in_RDI + 0x488) = in_RSI;
    if (in_RSI != 0) {
      TPZCompMesh::Reference(*(TPZCompMesh **)(in_RDI + 0x488));
      pvVar1 = operator_new(0x918);
      TPZCompMesh::TPZCompMesh(in_stack_00000090,in_stack_00000088,in_stack_00000087);
      *(void **)(in_RDI + 0x10) = pvVar1;
      SetAllCreateFunctionsPostProc(in_stack_00000170);
    }
  }
  return;
}

Assistant:

void TPZPostProcAnalysis::SetCompMesh(TPZCompMesh *pRef, bool mustOptimizeBandwidth)
{
    // the postprocess mesh already exists, do nothing
    if (fpMainMesh == pRef) {
        return;
    }
    
    if (fCompMesh) {
        delete fCompMesh;
        fCompMesh = 0;
        TPZLinearAnalysis::CleanUp();
    }

    fpMainMesh = pRef;
    
    if (!pRef) {
        return;
    }
    
    TPZCompMesh* pcMainMesh = fpMainMesh;
    
    TPZGeoMesh * pgmesh = pcMainMesh->Reference();

    TPZCompMesh * pcPostProcMesh = new TPZCompMesh(pgmesh);
    
    fCompMesh = pcPostProcMesh;
    
    TPZPostProcAnalysis::SetAllCreateFunctionsPostProc(pcPostProcMesh);
    
}